

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long_&,_unsigned_long> *params)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  String argValues [1];
  long *plVar3;
  undefined8 uVar4;
  long local_78;
  undefined8 uStack_70;
  undefined8 *puStack_68;
  char *local_60;
  long *local_58;
  undefined8 uStack_50;
  long local_48;
  undefined8 local_40;
  undefined8 *puStack_38;
  
  this->exception = (Exception *)0x0;
  local_60 = macroArgs;
  _::operator*(&local_48,params,CONCAT44(in_register_00000014,line),
               CONCAT44(in_register_0000000c,code));
  plVar3 = &local_78;
  local_78 = local_48;
  uStack_70 = local_40;
  puStack_68 = puStack_38;
  uStack_50 = 1;
  uVar4 = 1;
  local_58 = plVar3;
  init(this,(EVP_PKEY_CTX *)file);
  uVar2 = uStack_70;
  lVar1 = local_78;
  if (local_78 != 0) {
    local_78 = 0;
    uStack_70 = 0;
    (**(code **)*puStack_68)(puStack_68,lVar1,1,uVar2,uVar2,0,plVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}